

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDriver.cpp
# Opt level: O0

int main(void)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *paVar1;
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *paVar2;
  allocator<int> *paVar3;
  allocator<std::vector<int,_std::allocator<int>_>_> *paVar4;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_15;
  initializer_list<int> __l_16;
  initializer_list<int> __l_17;
  initializer_list<int> __l_18;
  initializer_list<int> __l_19;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_24;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_25;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_26;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_27;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_28;
  bool bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  reference pvVar9;
  reference pvVar10;
  size_type sVar11;
  reference pvVar12;
  ostream *poVar13;
  vector<int,_std::allocator<int>_> *local_1460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_13e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_13c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_13b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1368;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_11b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_11a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1188;
  vector<int,_std::allocator<int>_> *local_f78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ed0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_eb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_da0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d70;
  uint local_cfc;
  uint j_1;
  vector<int,_std::allocator<int>_> *i_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range1_3;
  reference local_cb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *i_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1_2;
  string local_c80;
  undefined1 local_c60 [8];
  Map invalidMap;
  int local_c40 [2];
  iterator local_c38;
  size_type local_c30;
  allocator<int> local_c21;
  int local_c20 [2];
  iterator local_c18;
  size_type local_c10;
  allocator<int> local_c01;
  int local_c00 [2];
  iterator local_bf8;
  size_type local_bf0;
  allocator<int> local_be1;
  int local_be0 [2];
  iterator local_bd8;
  size_type local_bd0;
  allocator<int> local_bc1;
  int local_bc0 [2];
  iterator local_bb8;
  size_type local_bb0;
  allocator<int> local_ba1;
  int local_ba0 [2];
  iterator local_b98;
  size_type local_b90;
  vector<int,_std::allocator<int>_> *local_b88;
  vector<int,_std::allocator<int>_> local_b80;
  vector<int,_std::allocator<int>_> local_b68;
  vector<int,_std::allocator<int>_> local_b50;
  vector<int,_std::allocator<int>_> local_b38;
  vector<int,_std::allocator<int>_> local_b20;
  vector<int,_std::allocator<int>_> local_b08;
  undefined1 local_af0 [24];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  invalidBorderData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  string local_a98 [32];
  string local_a78 [32];
  iterator local_a58;
  size_type local_a50;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a45 [2];
  allocator<char> local_a43;
  allocator<char> local_a42;
  allocator<char> local_a41 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  string local_a18 [32];
  string local_9f8 [32];
  iterator local_9d8;
  size_type local_9d0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9c5 [2];
  allocator<char> local_9c3;
  allocator<char> local_9c2;
  allocator<char> local_9c1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  string local_998 [32];
  string local_978 [32];
  iterator local_958;
  size_type local_950;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_945 [2];
  allocator<char> local_943;
  allocator<char> local_942;
  allocator<char> local_941 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  string local_918 [32];
  string local_8f8 [32];
  iterator local_8d8;
  size_type local_8d0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8c5 [2];
  allocator<char> local_8c3;
  allocator<char> local_8c2;
  allocator<char> local_8c1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  string local_898 [32];
  string local_878 [32];
  iterator local_858;
  size_type local_850;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_845 [2];
  allocator<char> local_843;
  allocator<char> local_842;
  allocator<char> local_841 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  string local_818 [32];
  string local_7f8 [32];
  iterator local_7d8;
  size_type local_7d0;
  undefined1 local_7c8 [8];
  undefined1 local_7c0 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_790;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_778;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_760;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_748;
  undefined1 local_730 [24];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  invalidCountryData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  string local_6d8 [32];
  iterator local_6b8;
  size_type local_6b0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6a4 [2];
  allocator<char> local_6a2;
  allocator<char> local_6a1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  string local_678 [32];
  iterator local_658;
  size_type local_650;
  undefined1 local_648 [8];
  undefined1 local_640 [48];
  undefined1 local_610 [24];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  invalidContinentData;
  string local_5e0 [8];
  string invalidMapName;
  uint j;
  vector<int,_std::allocator<int>_> *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range1_1;
  reference local_578;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *i;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  string local_540;
  undefined1 local_520 [8];
  Map validMap;
  int local_500 [2];
  iterator local_4f8;
  size_type local_4f0;
  allocator<int> local_4e5;
  int local_4e4 [3];
  iterator local_4d8;
  size_type local_4d0;
  allocator<int> local_4c5;
  int local_4c4 [3];
  iterator local_4b8;
  size_type local_4b0;
  allocator<int> local_4a1;
  int local_4a0 [2];
  iterator local_498;
  size_type local_490;
  vector<int,_std::allocator<int>_> *local_488;
  vector<int,_std::allocator<int>_> local_480;
  vector<int,_std::allocator<int>_> local_468;
  vector<int,_std::allocator<int>_> local_450;
  vector<int,_std::allocator<int>_> local_438;
  undefined1 local_420 [24];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  validBorderData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  string local_3c8 [32];
  string local_3a8 [32];
  iterator local_388;
  size_type local_380;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_375 [2];
  allocator<char> local_373;
  allocator<char> local_372;
  allocator<char> local_371 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348 [32];
  string local_328 [32];
  iterator local_308;
  size_type local_300;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f5 [2];
  allocator<char> local_2f3;
  allocator<char> local_2f2;
  allocator<char> local_2f1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  string local_2c8 [32];
  string local_2a8 [32];
  iterator local_288;
  size_type local_280;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_275 [2];
  allocator<char> local_273;
  allocator<char> local_272;
  allocator<char> local_271 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248 [32];
  string local_228 [32];
  iterator local_208;
  size_type local_200;
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  undefined1 local_190 [24];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  validCountryData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138 [32];
  iterator local_118;
  size_type local_110;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_104 [2];
  allocator<char> local_102;
  allocator<char> local_101 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8 [32];
  iterator local_b8;
  size_type local_b0;
  undefined1 local_a8 [8];
  undefined1 local_a0 [48];
  undefined1 local_70 [24];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  validContinentData;
  allocator<char> local_31;
  string local_30 [8];
  string validMapName;
  
  validMapName.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"vTest map",&local_31);
  std::allocator<char>::~allocator(&local_31);
  validCountryData.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  local_a8 = (undefined1  [8])local_a0;
  local_104[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_101._1_8_ = &local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"europe",local_101);
  local_101._1_8_ = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"2",&local_102);
  local_104[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_b8 = &local_f8;
  local_b0 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_104);
  __l_27._M_len = local_b0;
  __l_27._M_array = local_b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_a0,__l_27,local_104);
  validCountryData.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
  local_a8 = (undefined1  [8])(local_a0 + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"asia",
             (allocator<char> *)
             ((long)&validCountryData.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"4",
             (allocator<char> *)
             ((long)&validCountryData.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  validCountryData.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  local_118 = &local_158;
  local_110 = 2;
  paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&validCountryData.
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(paVar1);
  __l_26._M_len = local_110;
  __l_26._M_array = local_118;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_a0 + 0x18),__l_26,paVar1);
  validCountryData.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  local_70._0_8_ = local_a0;
  local_70._8_8_ = (pointer)0x2;
  paVar2 = (allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)((long)&validCountryData.
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::allocator(paVar2);
  __l_28._M_len = local_70._8_8_;
  __l_28._M_array = (iterator)local_70._0_8_;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)(local_70 + 0x10),__l_28,paVar2);
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~allocator((allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&validCountryData.
                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  local_d70 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_70;
  do {
    local_d70 = local_d70 + -1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_d70);
  } while (local_d70 !=
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_a0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&validCountryData.
                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_d88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118;
  do {
    local_d88 = local_d88 + -1;
    std::__cxx11::string::~string((string *)local_d88);
  } while (local_d88 != &local_158);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&validCountryData.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&validCountryData.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_104);
  local_da0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8;
  do {
    local_da0 = local_da0 + -1;
    std::__cxx11::string::~string((string *)local_da0);
  } while (local_da0 != &local_f8);
  std::allocator<char>::~allocator(&local_102);
  std::allocator<char>::~allocator(local_101);
  validBorderData.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
  local_1f8 = (undefined1  [8])local_1f0;
  local_275[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_271._1_8_ = &local_268;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"1",local_271);
  local_271._1_8_ = local_248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_248,"france",&local_272);
  local_271._1_8_ = local_228;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_228,"1",&local_273);
  local_275[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_208 = &local_268;
  local_200 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_275);
  __l_24._M_len = local_200;
  __l_24._M_array = local_208;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1f0,__l_24,local_275);
  local_2f5[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_2f1._1_8_ = &local_2e8;
  local_1f8 = (undefined1  [8])(local_1f0 + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"2",local_2f1);
  local_2f1._1_8_ = local_2c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c8,"germany",&local_2f2);
  local_2f1._1_8_ = local_2a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"1",&local_2f3);
  local_2f5[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_288 = &local_2e8;
  local_280 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_2f5);
  __l_23._M_len = local_280;
  __l_23._M_array = local_288;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_1f0 + 0x18),__l_23,local_2f5);
  local_375[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_371._1_8_ = &local_368;
  local_1f8 = (undefined1  [8])&local_1c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"3",local_371);
  local_371._1_8_ = local_348;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_348,"russia",&local_372);
  local_371._1_8_ = local_328;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_328,"2",&local_373);
  local_375[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_308 = &local_368;
  local_300 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_375);
  __l_22._M_len = local_300;
  __l_22._M_array = local_308;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1c0,__l_22,local_375);
  validBorderData.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
  local_1f8 = (undefined1  [8])&local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"4",
             (allocator<char> *)
             ((long)&validBorderData.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c8,"dawd",
             (allocator<char> *)
             ((long)&validBorderData.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3a8,"2",
             (allocator<char> *)
             ((long)&validBorderData.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  validBorderData.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
  local_388 = &local_3e8;
  local_380 = 3;
  paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&validBorderData.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(paVar1);
  __l_21._M_len = local_380;
  __l_21._M_array = local_388;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1a8,__l_21,paVar1);
  validBorderData.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  local_190._0_8_ = local_1f0;
  local_190._8_8_ = (pointer)0x4;
  paVar2 = (allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)((long)&validBorderData.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::allocator(paVar2);
  __l_25._M_len = local_190._8_8_;
  __l_25._M_array = (iterator)local_190._0_8_;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)(local_190 + 0x10),__l_25,paVar2);
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~allocator((allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&validBorderData.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  local_eb8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_190;
  do {
    local_eb8 = local_eb8 + -1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_eb8);
  } while (local_eb8 !=
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1f0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&validBorderData.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  local_ed0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388;
  do {
    local_ed0 = local_ed0 + -1;
    std::__cxx11::string::~string((string *)local_ed0);
  } while (local_ed0 != &local_3e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&validBorderData.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&validBorderData.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&validBorderData.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_375);
  local_ee8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308;
  do {
    local_ee8 = local_ee8 + -1;
    std::__cxx11::string::~string((string *)local_ee8);
  } while (local_ee8 != &local_368);
  std::allocator<char>::~allocator(&local_373);
  std::allocator<char>::~allocator(&local_372);
  std::allocator<char>::~allocator(local_371);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_2f5);
  local_f00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_288;
  do {
    local_f00 = local_f00 + -1;
    std::__cxx11::string::~string((string *)local_f00);
  } while (local_f00 != &local_2e8);
  std::allocator<char>::~allocator(&local_2f3);
  std::allocator<char>::~allocator(&local_2f2);
  std::allocator<char>::~allocator(local_2f1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_275);
  local_f18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208;
  do {
    local_f18 = local_f18 + -1;
    std::__cxx11::string::~string((string *)local_f18);
  } while (local_f18 != &local_268);
  std::allocator<char>::~allocator(&local_273);
  std::allocator<char>::~allocator(&local_272);
  std::allocator<char>::~allocator(local_271);
  validMap.pMapCountries._6_1_ = 1;
  local_4a0[0] = 1;
  local_4a0[1] = 2;
  local_498 = local_4a0;
  local_490 = 2;
  local_488 = &local_480;
  std::allocator<int>::allocator(&local_4a1);
  __l_19._M_len = local_490;
  __l_19._M_array = local_498;
  std::vector<int,_std::allocator<int>_>::vector(&local_480,__l_19,&local_4a1);
  local_4c4[0] = 2;
  local_4c4[1] = 1;
  local_4c4[2] = 3;
  local_4b8 = local_4c4;
  local_4b0 = 3;
  local_488 = &local_468;
  std::allocator<int>::allocator(&local_4c5);
  __l_18._M_len = local_4b0;
  __l_18._M_array = local_4b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_468,__l_18,&local_4c5);
  local_4e4[0] = 3;
  local_4e4[1] = 2;
  local_4e4[2] = 4;
  local_4d8 = local_4e4;
  local_4d0 = 3;
  local_488 = &local_450;
  std::allocator<int>::allocator(&local_4e5);
  __l_17._M_len = local_4d0;
  __l_17._M_array = local_4d8;
  std::vector<int,_std::allocator<int>_>::vector(&local_450,__l_17,&local_4e5);
  local_500[0] = 4;
  local_500[1] = 3;
  local_4f8 = local_500;
  local_4f0 = 2;
  paVar3 = (allocator<int> *)((long)&validMap.pMapCountries + 7);
  local_488 = &local_438;
  std::allocator<int>::allocator(paVar3);
  __l_16._M_len = local_4f0;
  __l_16._M_array = local_4f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_438,__l_16,paVar3);
  validMap.pMapCountries._6_1_ = 0;
  local_420._0_8_ = &local_480;
  local_420._8_8_ = (pointer)0x4;
  paVar4 = (allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&validMap.pMapCountries + 5)
  ;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(paVar4);
  __l_20._M_len = local_420._8_8_;
  __l_20._M_array = (iterator)local_420._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_420 + 0x10),__l_20,paVar4);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&validMap.pMapCountries + 5));
  local_f78 = (vector<int,_std::allocator<int>_> *)local_420;
  do {
    local_f78 = local_f78 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_f78);
  } while (local_f78 != &local_480);
  std::allocator<int>::~allocator((allocator<int> *)((long)&validMap.pMapCountries + 7));
  std::allocator<int>::~allocator(&local_4e5);
  std::allocator<int>::~allocator(&local_4c5);
  std::allocator<int>::~allocator(&local_4a1);
  std::__cxx11::string::string((string *)&local_540,local_30);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)&__range1,
           (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)(local_70 + 0x10));
  Map::Map((Map *)local_520,&local_540,
           (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)&__range1);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)&__range1);
  std::__cxx11::string::~string((string *)&local_540);
  __end1 = std::
           vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::begin((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)(local_190 + 0x10));
  i = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)std::
         vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::end((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)(local_190 + 0x10));
  while( true ) {
    bVar5 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                *)&i);
    if (!bVar5) break;
    local_578 = __gnu_cxx::
                __normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator*(&__end1);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_578,0);
    iVar6 = std::__cxx11::stoi(pvVar9,(size_t *)0x0,10);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_578,1);
    std::__cxx11::string::string((string *)&__range1_1,(string *)pvVar9);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_578,2);
    iVar7 = std::__cxx11::stoi(pvVar9,(size_t *)0x0,10);
    Map::addNode((Map *)local_520,iVar6,(string *)&__range1_1,iVar7);
    std::__cxx11::string::~string((string *)&__range1_1);
    __gnu_cxx::
    __normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::begin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(local_420 + 0x10));
  i_1 = (vector<int,_std::allocator<int>_> *)
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::end((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)(local_420 + 0x10));
  while( true ) {
    bVar5 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                        *)&i_1);
    if (!bVar5) break;
    pvVar10 = __gnu_cxx::
              __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator*(&__end1_1);
    invalidMapName.field_2._12_4_ = 1;
    while( true ) {
      uVar8 = (ulong)(uint)invalidMapName.field_2._12_4_;
      sVar11 = std::vector<int,_std::allocator<int>_>::size(pvVar10);
      if (sVar11 <= uVar8) break;
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,0);
      iVar6 = *pvVar12;
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                          (pvVar10,(ulong)(uint)invalidMapName.field_2._12_4_);
      Map::addEdge((Map *)local_520,iVar6,*pvVar12);
      invalidMapName.field_2._12_4_ = invalidMapName.field_2._12_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5e0,"vTest map",
             (allocator<char> *)
             ((long)&invalidContinentData.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&invalidContinentData.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  invalidCountryData.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  local_648 = (undefined1  [8])local_640;
  local_6a4[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_6a1._1_8_ = &local_698;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"europe",local_6a1);
  local_6a1._1_8_ = local_678;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_678,"2",&local_6a2);
  local_6a4[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_658 = &local_698;
  local_650 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_6a4);
  __l_14._M_len = local_650;
  __l_14._M_array = local_658;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_640,__l_14,local_6a4);
  invalidCountryData.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
  local_648 = (undefined1  [8])(local_640 + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f8,"asia",
             (allocator<char> *)
             ((long)&invalidCountryData.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6d8,"4",
             (allocator<char> *)
             ((long)&invalidCountryData.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  invalidCountryData.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  local_6b8 = &local_6f8;
  local_6b0 = 2;
  paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&invalidCountryData.
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(paVar1);
  __l_13._M_len = local_6b0;
  __l_13._M_array = local_6b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_640 + 0x18),__l_13,paVar1);
  invalidCountryData.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  local_610._0_8_ = local_640;
  local_610._8_8_ = (pointer)0x2;
  paVar2 = (allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)((long)&invalidCountryData.
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::allocator(paVar2);
  __l_15._M_len = local_610._8_8_;
  __l_15._M_array = (iterator)local_610._0_8_;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)(local_610 + 0x10),__l_15,paVar2);
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~allocator((allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&invalidCountryData.
                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  local_1188 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_610;
  do {
    local_1188 = local_1188 + -1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_1188);
  } while (local_1188 !=
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_640);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&invalidCountryData.
                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_11a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6b8;
  do {
    local_11a0 = local_11a0 + -1;
    std::__cxx11::string::~string((string *)local_11a0);
  } while (local_11a0 != &local_6f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&invalidCountryData.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&invalidCountryData.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_6a4);
  local_11b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_658;
  do {
    local_11b8 = local_11b8 + -1;
    std::__cxx11::string::~string((string *)local_11b8);
  } while (local_11b8 != &local_698);
  std::allocator<char>::~allocator(&local_6a2);
  std::allocator<char>::~allocator(local_6a1);
  invalidBorderData.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
  local_7c8 = (undefined1  [8])local_7c0;
  local_845[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_841._1_8_ = &local_838;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_838,"1",local_841);
  local_841._1_8_ = local_818;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_818,"france",&local_842);
  local_841._1_8_ = local_7f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7f8,"1",&local_843);
  local_845[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_7d8 = &local_838;
  local_7d0 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_845);
  __l_11._M_len = local_7d0;
  __l_11._M_array = local_7d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_7c0,__l_11,local_845);
  local_8c5[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_8c1._1_8_ = &local_8b8;
  local_7c8 = (undefined1  [8])(local_7c0 + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b8,"2",local_8c1);
  local_8c1._1_8_ = local_898;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_898,"germany",&local_8c2);
  local_8c1._1_8_ = local_878;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_878,"1",&local_8c3);
  local_8c5[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_858 = &local_8b8;
  local_850 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_8c5);
  __l_10._M_len = local_850;
  __l_10._M_array = local_858;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_7c0 + 0x18),__l_10,local_8c5);
  local_945[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_941._1_8_ = &local_938;
  local_7c8 = (undefined1  [8])&local_790;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"3",local_941);
  local_941._1_8_ = local_918;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_918,"russia",&local_942);
  local_941._1_8_ = local_8f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8f8,"2",&local_943);
  local_945[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_8d8 = &local_938;
  local_8d0 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_945);
  __l_09._M_len = local_8d0;
  __l_09._M_array = local_8d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_790,__l_09,local_945);
  local_9c5[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_9c1._1_8_ = &local_9b8;
  local_7c8 = (undefined1  [8])&local_778;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b8,"4",local_9c1);
  local_9c1._1_8_ = local_998;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_998,"kongo",&local_9c2);
  local_9c1._1_8_ = local_978;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_978,"1",&local_9c3);
  local_9c5[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_958 = &local_9b8;
  local_950 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_9c5);
  __l_08._M_len = local_950;
  __l_08._M_array = local_958;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_778,__l_08,local_9c5);
  local_a45[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_a41._1_8_ = &local_a38;
  local_7c8 = (undefined1  [8])&local_760;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a38,"5",local_a41);
  local_a41._1_8_ = local_a18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a18,"lebanon",&local_a42);
  local_a41._1_8_ = local_9f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9f8,"2",&local_a43);
  local_a45[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_9d8 = &local_a38;
  local_9d0 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_a45);
  __l_07._M_len = local_9d0;
  __l_07._M_array = local_9d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_760,__l_07,local_a45);
  invalidBorderData.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
  local_7c8 = (undefined1  [8])&local_748;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ab8,"6",
             (allocator<char> *)
             ((long)&invalidBorderData.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a98,"nepal",
             (allocator<char> *)
             ((long)&invalidBorderData.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a78,"2",
             (allocator<char> *)
             ((long)&invalidBorderData.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  invalidBorderData.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
  local_a58 = &local_ab8;
  local_a50 = 3;
  paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&invalidBorderData.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(paVar1);
  __l_06._M_len = local_a50;
  __l_06._M_array = local_a58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_748,__l_06,paVar1);
  invalidBorderData.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  local_730._0_8_ = local_7c0;
  local_730._8_8_ = (pointer)0x6;
  paVar2 = (allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)((long)&invalidBorderData.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::allocator(paVar2);
  __l_12._M_len = local_730._8_8_;
  __l_12._M_array = (iterator)local_730._0_8_;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)(local_730 + 0x10),__l_12,paVar2);
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~allocator((allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&invalidBorderData.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  local_1350 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_730;
  do {
    local_1350 = local_1350 + -1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_1350);
  } while (local_1350 !=
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_7c0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&invalidBorderData.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  local_1368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a58;
  do {
    local_1368 = local_1368 + -1;
    std::__cxx11::string::~string((string *)local_1368);
  } while (local_1368 != &local_ab8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&invalidBorderData.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&invalidBorderData.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&invalidBorderData.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_a45);
  local_1380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_9d8;
  do {
    local_1380 = local_1380 + -1;
    std::__cxx11::string::~string((string *)local_1380);
  } while (local_1380 != &local_a38);
  std::allocator<char>::~allocator(&local_a43);
  std::allocator<char>::~allocator(&local_a42);
  std::allocator<char>::~allocator(local_a41);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_9c5);
  local_1398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_958;
  do {
    local_1398 = local_1398 + -1;
    std::__cxx11::string::~string((string *)local_1398);
  } while (local_1398 != &local_9b8);
  std::allocator<char>::~allocator(&local_9c3);
  std::allocator<char>::~allocator(&local_9c2);
  std::allocator<char>::~allocator(local_9c1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_945);
  local_13b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_8d8;
  do {
    local_13b0 = local_13b0 + -1;
    std::__cxx11::string::~string((string *)local_13b0);
  } while (local_13b0 != &local_938);
  std::allocator<char>::~allocator(&local_943);
  std::allocator<char>::~allocator(&local_942);
  std::allocator<char>::~allocator(local_941);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_8c5);
  local_13c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_858;
  do {
    local_13c8 = local_13c8 + -1;
    std::__cxx11::string::~string((string *)local_13c8);
  } while (local_13c8 != &local_8b8);
  std::allocator<char>::~allocator(&local_8c3);
  std::allocator<char>::~allocator(&local_8c2);
  std::allocator<char>::~allocator(local_8c1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_845);
  local_13e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_7d8;
  do {
    local_13e0 = local_13e0 + -1;
    std::__cxx11::string::~string((string *)local_13e0);
  } while (local_13e0 != &local_838);
  std::allocator<char>::~allocator(&local_843);
  std::allocator<char>::~allocator(&local_842);
  std::allocator<char>::~allocator(local_841);
  invalidMap.pMapCountries._6_1_ = 1;
  local_ba0[0] = 1;
  local_ba0[1] = 2;
  local_b98 = local_ba0;
  local_b90 = 2;
  local_b88 = &local_b80;
  std::allocator<int>::allocator(&local_ba1);
  __l_04._M_len = local_b90;
  __l_04._M_array = local_b98;
  std::vector<int,_std::allocator<int>_>::vector(&local_b80,__l_04,&local_ba1);
  local_bc0[0] = 2;
  local_bc0[1] = 3;
  local_bb8 = local_bc0;
  local_bb0 = 2;
  local_b88 = &local_b68;
  std::allocator<int>::allocator(&local_bc1);
  __l_03._M_len = local_bb0;
  __l_03._M_array = local_bb8;
  std::vector<int,_std::allocator<int>_>::vector(&local_b68,__l_03,&local_bc1);
  local_be0[0] = 3;
  local_be0[1] = 1;
  local_bd8 = local_be0;
  local_bd0 = 2;
  local_b88 = &local_b50;
  std::allocator<int>::allocator(&local_be1);
  __l_02._M_len = local_bd0;
  __l_02._M_array = local_bd8;
  std::vector<int,_std::allocator<int>_>::vector(&local_b50,__l_02,&local_be1);
  local_c00[0] = 4;
  local_c00[1] = 5;
  local_bf8 = local_c00;
  local_bf0 = 2;
  local_b88 = &local_b38;
  std::allocator<int>::allocator(&local_c01);
  __l_01._M_len = local_bf0;
  __l_01._M_array = local_bf8;
  std::vector<int,_std::allocator<int>_>::vector(&local_b38,__l_01,&local_c01);
  local_c20[0] = 5;
  local_c20[1] = 6;
  local_c18 = local_c20;
  local_c10 = 2;
  local_b88 = &local_b20;
  std::allocator<int>::allocator(&local_c21);
  __l_00._M_len = local_c10;
  __l_00._M_array = local_c18;
  std::vector<int,_std::allocator<int>_>::vector(&local_b20,__l_00,&local_c21);
  local_c40[0] = 6;
  local_c40[1] = 4;
  local_c38 = local_c40;
  local_c30 = 2;
  paVar3 = (allocator<int> *)((long)&invalidMap.pMapCountries + 7);
  local_b88 = &local_b08;
  std::allocator<int>::allocator(paVar3);
  __l._M_len = local_c30;
  __l._M_array = local_c38;
  std::vector<int,_std::allocator<int>_>::vector(&local_b08,__l,paVar3);
  invalidMap.pMapCountries._6_1_ = 0;
  local_af0._0_8_ = &local_b80;
  local_af0._8_8_ = (pointer)0x6;
  paVar4 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
           ((long)&invalidMap.pMapCountries + 5);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(paVar4);
  __l_05._M_len = local_af0._8_8_;
  __l_05._M_array = (iterator)local_af0._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_af0 + 0x10),__l_05,paVar4);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&invalidMap.pMapCountries + 5));
  local_1460 = (vector<int,_std::allocator<int>_> *)local_af0;
  do {
    local_1460 = local_1460 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_1460);
  } while (local_1460 != &local_b80);
  std::allocator<int>::~allocator((allocator<int> *)((long)&invalidMap.pMapCountries + 7));
  std::allocator<int>::~allocator(&local_c21);
  std::allocator<int>::~allocator(&local_c01);
  std::allocator<int>::~allocator(&local_be1);
  std::allocator<int>::~allocator(&local_bc1);
  std::allocator<int>::~allocator(&local_ba1);
  std::__cxx11::string::string((string *)&local_c80,local_5e0);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)&__range1_2,
           (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)(local_610 + 0x10));
  Map::Map((Map *)local_c60,&local_c80,
           (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)&__range1_2);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)&__range1_2);
  std::__cxx11::string::~string((string *)&local_c80);
  __end1_2 = std::
             vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::begin((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)(local_730 + 0x10));
  i_2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)std::
           vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::end((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)(local_730 + 0x10));
  while( true ) {
    bVar5 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&i_2);
    if (!bVar5) break;
    local_cb8 = __gnu_cxx::
                __normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator*(&__end1_2);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_cb8,0);
    iVar6 = std::__cxx11::stoi(pvVar9,(size_t *)0x0,10);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_cb8,1);
    std::__cxx11::string::string((string *)&__range1_3,(string *)pvVar9);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_cb8,2);
    iVar7 = std::__cxx11::stoi(pvVar9,(size_t *)0x0,10);
    Map::addNode((Map *)local_c60,iVar6,(string *)&__range1_3,iVar7);
    std::__cxx11::string::~string((string *)&__range1_3);
    __gnu_cxx::
    __normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::operator++(&__end1_2);
  }
  __end1_3 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::begin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(local_af0 + 0x10));
  i_3 = (vector<int,_std::allocator<int>_> *)
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::end((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)(local_af0 + 0x10));
  while( true ) {
    bVar5 = __gnu_cxx::operator!=
                      (&__end1_3,
                       (__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                        *)&i_3);
    if (!bVar5) break;
    pvVar10 = __gnu_cxx::
              __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator*(&__end1_3);
    local_cfc = 1;
    while( true ) {
      sVar11 = std::vector<int,_std::allocator<int>_>::size(pvVar10);
      if (sVar11 <= local_cfc) break;
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,0);
      iVar6 = *pvVar12;
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(ulong)local_cfc);
      Map::addEdge((Map *)local_c60,iVar6,*pvVar12);
      local_cfc = local_cfc + 1;
    }
    __gnu_cxx::
    __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator++(&__end1_3);
  }
  poVar13 = std::operator<<((ostream *)&std::cout,"Testing valid map...\n Connected : ");
  bVar5 = Map::testConnected((Map *)local_520);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,bVar5);
  std::operator<<(poVar13,"\n");
  poVar13 = std::operator<<((ostream *)&std::cout,"Testing invalid map...\n Connected : ");
  bVar5 = Map::testConnected((Map *)local_c60);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,bVar5);
  std::operator<<(poVar13,"\n");
  validMapName.field_2._12_4_ = 0;
  Map::~Map((Map *)local_c60);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_af0 + 0x10));
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)(local_730 + 0x10));
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)(local_610 + 0x10));
  std::__cxx11::string::~string(local_5e0);
  Map::~Map((Map *)local_520);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_420 + 0x10));
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)(local_190 + 0x10));
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)(local_70 + 0x10));
  std::__cxx11::string::~string(local_30);
  return validMapName.field_2._12_4_;
}

Assistant:

int main() {
    //more extensive tests are performed in the MapLoader (on the data being submitted)

    //declare valid map information
    std::string validMapName = "vTest map";
    std::vector<std::vector<std::string>> validContinentData = {{"europe", "2"},
                                                                {"asia",   "4"}};
    std::vector<std::vector<std::string>> validCountryData = {{"1", "france",  "1"},
                                                              {"2", "germany", "1"},
                                                              {"3", "russia",  "2"},
                                                              {"4","dawd", "2"}};
    std::vector<std::vector<int>> validBorderData = {{1, 2},
                                                     {2, 1, 3},
                                                     {3, 2, 4},
                                                     {4, 3}};
    //create map object with empty continents
    Map validMap = Map(validMapName, validContinentData);
    //add countries to map and continents
    for (auto& i : validCountryData) {
        validMap.addNode(std::stoi(i[0]), i[1], std::stoi(i[2]));
    }

    //add adjacency
    for (auto& i : validBorderData) {
        for (unsigned int j = 1; j < i.size(); j++) {
            validMap.addEdge(i[0], i[j]);
        }
    }

    //declare invalid map information
    std::string invalidMapName = "vTest map";
    std::vector<std::vector<std::string>> invalidContinentData = {{"europe", "2"},
                                                                  {"asia",   "4"}};
    std::vector<std::vector<std::string>> invalidCountryData = {{"1", "france",  "1"},
                                                                {"2", "germany", "1"},
                                                                {"3", "russia",  "2"},
                                                                {"4", "kongo",  "1"},
                                                                {"5", "lebanon",  "2"},
                                                                {"6", "nepal",  "2"}};
    std::vector<std::vector<int>> invalidBorderData = {{1, 2},
                                                       {2, 3},
                                                       {3, 1},
                                                       {4,5},
                                                       {5,6},
                                                       {6,4}};
    //create map object with empty continents
    Map invalidMap = Map(invalidMapName, invalidContinentData);
    //add countries to map and continents
    for (auto& i : invalidCountryData) {
        invalidMap.addNode(std::stoi(i[0]), i[1], std::stoi(i[2]));
    }

    //add adjacency
    for (auto& i : invalidBorderData) {
        for (unsigned int j = 1; j < i.size(); j++) {
            invalidMap.addEdge(i[0], i[j]);
        }
    }

    //test maps
//    validMap.printMap();
//    invalidMap.printMap();
    std::cout << "Testing valid map...\n Connected : " << validMap.testConnected() << "\n";
    std::cout << "Testing invalid map...\n Connected : " << invalidMap.testConnected() << "\n";
    return 0;
}